

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O2

target_ulong_conflict pmpaddr_csr_read_riscv32(CPURISCVState_conflict *env,uint32_t addr_index)

{
  target_ulong_conflict tVar1;
  
  tVar1 = 0;
  if (addr_index < 0x10) {
    tVar1 = (env->pmp_state).pmp[addr_index].addr_reg;
  }
  return tVar1;
}

Assistant:

target_ulong pmpaddr_csr_read(CPURISCVState *env, uint32_t addr_index)
{
    target_ulong val = 0;

    if (addr_index < MAX_RISCV_PMPS) {
        val = env->pmp_state.pmp[addr_index].addr_reg;
    } else {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpaddr read - out of bounds\n");
    }

    return val;
}